

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

int lj_ir_strcmp(GCstr *a,GCstr *b,IROp op)

{
  int32_t iVar1;
  undefined4 in_EDX;
  GCstr *in_RSI;
  GCstr *in_RDI;
  int res;
  uint local_4;
  
  iVar1 = lj_str_cmp(in_RDI,in_RSI);
  switch(in_EDX) {
  case 0:
    local_4 = (uint)(iVar1 < 0);
    break;
  case 1:
    local_4 = (uint)(-1 < iVar1);
    break;
  case 2:
    local_4 = (uint)(iVar1 < 1);
    break;
  case 3:
    local_4 = (uint)(0 < iVar1);
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int lj_ir_strcmp(GCstr *a, GCstr *b, IROp op)
{
  int res = lj_str_cmp(a, b);
  switch (op) {
  case IR_LT: return (res < 0);
  case IR_GE: return (res >= 0);
  case IR_LE: return (res <= 0);
  case IR_GT: return (res > 0);
  default: lua_assert(0); return 0;
  }
}